

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O1

char * strip_spaces(char *name)

{
  size_t sVar1;
  byte bVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  
  bVar2 = *name;
  while ((bVar2 != 0 && (iVar3 = OPENSSL_isspace((uint)bVar2), iVar3 != 0))) {
    bVar2 = name[1];
    name = name + 1;
  }
  if (*name == '\0') {
    pcVar5 = (char *)0x0;
  }
  else {
    sVar4 = strlen(name);
    do {
      sVar1 = sVar4;
      sVar4 = sVar1 - 1;
      if (sVar4 == 0) goto LAB_0032742d;
      iVar3 = OPENSSL_isspace((uint)(byte)name[sVar4]);
    } while (iVar3 != 0);
    name[sVar1] = '\0';
LAB_0032742d:
    pcVar5 = (char *)0x0;
    if (*name != '\0') {
      pcVar5 = name;
    }
  }
  return pcVar5;
}

Assistant:

static char *strip_spaces(char *name) {
  char *p, *q;
  // Skip over leading spaces
  p = name;
  while (*p && OPENSSL_isspace((unsigned char)*p)) {
    p++;
  }
  if (!*p) {
    return NULL;
  }
  q = p + strlen(p) - 1;
  while ((q != p) && OPENSSL_isspace((unsigned char)*q)) {
    q--;
  }
  if (p != q) {
    q[1] = 0;
  }
  if (!*p) {
    return NULL;
  }
  return p;
}